

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::EqualityComparisonOp<false>::evaluate
          (EqualityComparisonOp<false> *this,ExecValueAccess dst,ExecConstValueAccess a,
          ExecConstValueAccess b)

{
  float fVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  VariableType *this_00;
  long lVar5;
  Scalar *pSVar6;
  byte bVar7;
  Scalar *pSVar8;
  long lVar9;
  uint uVar10;
  
  pSVar6 = dst.super_ConstStridedValueAccess<64>.m_value;
  pSVar8 = a.m_value;
  this_00 = a.m_type;
  TVar3 = this_00->m_baseType;
  if (TVar3 == TYPE_FLOAT) {
    lVar5 = 0;
    do {
      uVar10 = 0;
      if (0 < this_00->m_numElements) {
        lVar9 = 0;
        bVar7 = 0;
        do {
          VariableType::getElementType(this_00);
          fVar1 = pSVar8[lVar5 + (int)uVar10].floatVal;
          VariableType::getElementType(b.m_type);
          bVar7 = bVar7 | fVar1 != b.m_value[lVar5 + (int)uVar10].floatVal;
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 0x40;
        } while (lVar9 < this_00->m_numElements);
        uVar10 = (uint)bVar7;
      }
      pSVar6[lVar5].boolVal = SUB41(uVar10,0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
  }
  else if (TVar3 == TYPE_INT) {
    lVar5 = 0;
    do {
      uVar10 = 0;
      if (0 < this_00->m_numElements) {
        lVar9 = 0;
        bVar7 = 0;
        do {
          VariableType::getElementType(this_00);
          iVar4 = pSVar8[lVar5 + (int)uVar10].intVal;
          VariableType::getElementType(b.m_type);
          bVar7 = bVar7 | iVar4 != b.m_value[lVar5 + (int)uVar10].intVal;
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 0x40;
        } while (lVar9 < this_00->m_numElements);
        uVar10 = (uint)bVar7;
      }
      pSVar6[lVar5].boolVal = SUB41(uVar10,0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
  }
  else if (TVar3 == TYPE_BOOL) {
    lVar5 = 0;
    do {
      uVar10 = 0;
      if (0 < this_00->m_numElements) {
        lVar9 = 0;
        bVar7 = 0;
        do {
          VariableType::getElementType(this_00);
          bVar2 = pSVar8[lVar5 + (int)uVar10].boolVal;
          VariableType::getElementType(b.m_type);
          bVar7 = bVar7 | bVar2 != b.m_value[lVar5 + (int)uVar10].boolVal;
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 0x40;
        } while (lVar9 < this_00->m_numElements);
        uVar10 = (uint)bVar7;
      }
      pSVar6[lVar5].boolVal = SUB41(uVar10,0);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
  }
  return;
}

Assistant:

void EqualityComparisonOp<IsEqual>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());


	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asBool(compNdx), b.component(elemNdx).asBool(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}